

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int histo_minmax_expr_workfn
              (long totalrows,long offset,long firstrow,long nrows,int nCols,iteratorCol *colData,
              void *userPtr)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  int iVar4;
  iteratorCol *outcol;
  ParseStatusVariables *pv;
  histo_minmax_workfn_struct *wf;
  double nulval;
  double *data;
  long i;
  int status;
  iteratorCol *colData_local;
  int nCols_local;
  long nrows_local;
  long firstrow_local;
  long offset_local;
  long totalrows_local;
  
  lVar2 = *userPtr;
  iVar4 = fits_parser_workfn(totalrows,offset,firstrow,nrows,nCols,colData,*userPtr);
  pdVar3 = (double *)colData[nCols + -1].array;
  dVar1 = **(double **)(*userPtr + 0x10);
  for (data = (double *)0x1; (long)data <= nrows * *(long *)(lVar2 + 0x50);
      data = (double *)((long)data + 1)) {
    if ((((*pdVar3 == 0.0) && (!NAN(*pdVar3))) || (pdVar3[(long)data] != dVar1)) ||
       (NAN(pdVar3[(long)data]) || NAN(dVar1))) {
      if ((pdVar3[(long)data] < *(double *)((long)userPtr + 8)) ||
         ((*(double *)((long)userPtr + 8) == -9.1191291391491e-36 &&
          (!NAN(*(double *)((long)userPtr + 8)))))) {
        *(double *)((long)userPtr + 8) = pdVar3[(long)data];
      }
      if ((*(double *)((long)userPtr + 0x10) <= pdVar3[(long)data] &&
           pdVar3[(long)data] != *(double *)((long)userPtr + 0x10)) ||
         ((*(double *)((long)userPtr + 0x10) == -9.1191291391491e-36 &&
          (!NAN(*(double *)((long)userPtr + 0x10)))))) {
        *(double *)((long)userPtr + 0x10) = pdVar3[(long)data];
      }
      *(long *)((long)userPtr + 0x20) = *(long *)((long)userPtr + 0x20) + 1;
    }
    *(long *)((long)userPtr + 0x18) = *(long *)((long)userPtr + 0x18) + 1;
  }
  return iVar4;
}

Assistant:

static int histo_minmax_expr_workfn( long    totalrows,     /* I - Total rows to be processed     */
                long    offset,        /* I - Number of rows skipped at start*/
                long    firstrow,      /* I - First row of this iteration    */
                long    nrows,         /* I - Number of rows in this iter    */
                int      nCols,        /* I - Number of columns in use       */
                iteratorCol *colData,  /* IO- Column information/data        */
                void    *userPtr )     /* I - Data handling instructions     */
/*                                                                           */
/* Iterator work function which evaluates a parser result and computes       */
/* min max value */
/*---------------------------------------------------------------------------*/
{
  int status = 0;
  long i;
  double *data;
  double nulval;
  struct histo_minmax_workfn_struct *wf = ((struct histo_minmax_workfn_struct *)userPtr);
  struct ParseStatusVariables *pv = &(wf->Info->parseVariables);
  iteratorCol *outcol = &(colData[nCols-1]);

  /* Call calculator work function.  Result is put in final column of colData as a TemporaryCol */
  status = fits_parser_workfn(totalrows, offset, firstrow, nrows, 
			      nCols, colData, (void *) wf->Info);

  /* The result of the calculation is in pv->Data, and null value in pv->Null */
  data = (double *)(outcol->array);
  nulval = *((double *)(wf->Info->nullPtr));

  for (i = 1; i<=(nrows*pv->repeat); i++ ) {
    /* Note that data[0] == 0 indicates no null values at all!!! */
    if (data[0] == 0 || data[i] != nulval) {
      if (data[i] < wf->datamin || wf->datamin == DOUBLENULLVALUE) wf->datamin = data[i];
      if (data[i] > wf->datamax || wf->datamax == DOUBLENULLVALUE) wf->datamax = data[i];
      wf->ngood ++;
    }
     wf->ntotal ++;
  }

  return status;
}